

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O2

void __thiscall
adios2::helper::NetworkSocket::Connect
          (NetworkSocket *this,string *hostname,uint16_t port,string *protocol)

{
  in_addr_t iVar1;
  int iVar2;
  protoent *ppVar3;
  hostent *phVar4;
  char *__cp;
  NetworkSocketData *__addr;
  allocator local_133;
  allocator local_132;
  allocator local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppVar3 = getprotobyname((protocol->_M_dataplus)._M_p);
  if (ppVar3 == (protoent *)0x0) {
    std::__cxx11::string::string((string *)&local_d0,"Helper",(allocator *)&local_70);
    std::__cxx11::string::string((string *)&local_f0,"helper:adiosNetwork",(allocator *)&local_90);
    std::__cxx11::string::string((string *)&local_110,"ConnectToServer",&local_133);
    std::operator+(&local_b0,"error: Cannot make getprotobyname \"",protocol);
    std::operator+(&local_130,&local_b0,"\"");
    Throw<std::ios_base::failure[abi:cxx11]>(&local_d0,&local_f0,&local_110,&local_130,-1);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::__cxx11::string::string((string *)&local_50,(string *)hostname);
  phVar4 = gethostbyname(local_50._M_dataplus._M_p);
  if (phVar4 == (hostent *)0x0) {
    std::__cxx11::string::string((string *)&local_d0,"Helper",(allocator *)&local_b0);
    std::__cxx11::string::string((string *)&local_f0,"helper:adiosNetwork",(allocator *)&local_70);
    std::__cxx11::string::string((string *)&local_110,"ResolveHostName",(allocator *)&local_90);
    std::operator+(&local_130,"error: gethostbyname ",&local_50);
    Throw<std::ios_base::failure[abi:cxx11]>(&local_d0,&local_f0,&local_110,&local_130,-1);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  __cp = inet_ntoa((in_addr)*(in_addr_t *)*phVar4->h_addr_list);
  iVar1 = inet_addr(__cp);
  if (iVar1 == 0xffffffff) {
    std::__cxx11::string::string((string *)&local_d0,"Helper",(allocator *)&local_70);
    std::__cxx11::string::string((string *)&local_f0,"helper:adiosNetwork",(allocator *)&local_90);
    std::__cxx11::string::string((string *)&local_110,"ResolveHostName",&local_133);
    std::__cxx11::string::string((string *)&local_b0,*phVar4->h_addr_list,&local_132);
    std::operator+(&local_130,"error: inet_addr ",&local_b0);
    Throw<std::ios_base::failure[abi:cxx11]>(&local_d0,&local_f0,&local_110,&local_130,-1);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  *(ulong *)&this->m_Data->m_Sockaddr = (ulong)CONCAT42(iVar1,port << 8 | port >> 8) * 0x10000 + 2;
  std::__cxx11::string::~string((string *)&local_50);
  iVar2 = socket(2,1,ppVar3->p_proto);
  __addr = this->m_Data;
  __addr->m_Socket = iVar2;
  if (iVar2 == -1) {
    std::__cxx11::string::string((string *)&local_d0,"Helper",(allocator *)&local_b0);
    std::__cxx11::string::string((string *)&local_f0,"helper:adiosNetwork",(allocator *)&local_70);
    std::__cxx11::string::string((string *)&local_110,"ConnectToServer",(allocator *)&local_90);
    std::__cxx11::string::string((string *)&local_130,"error: Cannot create socket",&local_133);
    Throw<std::ios_base::failure[abi:cxx11]>(&local_d0,&local_f0,&local_110,&local_130,-1);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    __addr = this->m_Data;
    iVar2 = __addr->m_Socket;
  }
  iVar2 = connect(iVar2,(sockaddr *)__addr,0x10);
  if (iVar2 == -1) {
    std::__cxx11::string::string((string *)&local_d0,"Helper",&local_133);
    std::__cxx11::string::string((string *)&local_f0,"helper:adiosNetwork",&local_132);
    std::__cxx11::string::string((string *)&local_110,"ConnectToServer",&local_131);
    std::operator+(&local_70,"error: Cannot connect to server at ",hostname);
    std::operator+(&local_b0,&local_70,":");
    std::__cxx11::to_string(&local_90,(uint)port);
    std::operator+(&local_130,&local_b0,&local_90);
    Throw<std::ios_base::failure[abi:cxx11]>(&local_d0,&local_f0,&local_110,&local_130,-1);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  return;
}

Assistant:

void NetworkSocket::Connect(std::string hostname, uint16_t port, std::string protocol)
{
    struct protoent *protoent = getprotobyname(protocol.c_str());
    if (protoent == NULL)
    {
        helper::Throw<std::ios_base::failure>("Helper", "helper:adiosNetwork", "ConnectToServer",
                                              "error: Cannot make getprotobyname \"" + protocol +
                                                  "\"");
    }

    m_Data->m_Sockaddr = ResolveHostName(hostname, port);

    m_Data->m_Socket = socket(AF_INET, SOCK_STREAM, protoent->p_proto);
    if (m_Data->m_Socket == -1)
    {
        helper::Throw<std::ios_base::failure>("Helper", "helper:adiosNetwork", "ConnectToServer",
                                              "error: Cannot create socket");
    }

    int result = connect(m_Data->m_Socket, (sockaddr *)&(m_Data->m_Sockaddr), sizeof(sockaddr));

    if (result == -1)
    {
        helper::Throw<std::ios_base::failure>("Helper", "helper:adiosNetwork", "ConnectToServer",
                                              "error: Cannot connect to server at " + hostname +
                                                  ":" + std::to_string(port));
    }
}